

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdNameMap.h
# Opt level: O3

void __thiscall
Rml::IdNameMap<Rml::ShorthandId>::AddPair
          (IdNameMap<Rml::ShorthandId> *this,ShorthandId id,String *name)

{
  code *pcVar1;
  bool bVar2;
  pointer pbVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  ShorthandId local_31;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::ShorthandId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  local_30;
  
  uVar4 = CONCAT71(in_register_00000031,id) & 0xffffffff;
  pbVar3 = (this->name_map).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_31 = id;
  if ((ulong)((long)(this->name_map).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar4) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this,uVar4 + 1);
    pbVar3 = (this->name_map).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  ::std::__cxx11::string::_M_assign
            ((string *)
             ((long)&(pbVar3->_M_dataplus)._M_p +
             (ulong)(uint)((int)CONCAT71(in_register_00000031,id) << 5)));
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,Rml::ShorthandId,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::emplace<std::__cxx11::string_const&,Rml::ShorthandId&>
            (&local_30,
             (Table<true,80ul,std::__cxx11::string,Rml::ShorthandId,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)&this->reverse_map,name,&local_31);
  if (local_30.second == false) {
    bVar2 = Assert("RMLUI_ASSERT(inserted)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/IdNameMap.h"
                   ,0x3c);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void AddPair(ID id, const String& name)
	{
		// Should only be used for defined IDs
		if ((size_t)id >= name_map.size())
			name_map.resize(1 + (size_t)id);
		name_map[(size_t)id] = name;
		bool inserted = reverse_map.emplace(name, id).second;
		RMLUI_ASSERT(inserted);
		(void)inserted;
	}